

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O2

void cf2_doFlex(CF2_Stack opStack,CF2_F16Dot16 *curX,CF2_F16Dot16 *curY,CF2_GlyphPath glyphPath,
               FT_Bool *readFromStack,FT_Bool doConditionalLastRead)

{
  FT_Bool FVar1;
  int iVar2;
  int *piVar3;
  CF2_F16Dot16 CVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  FT_UFast idx;
  undefined7 in_register_00000089;
  int iVar8;
  undefined8 uStackY_b0;
  CF2_F16Dot16 CStack_a4;
  undefined8 local_a0;
  CF2_F16Dot16 local_98 [2];
  int aiStack_90 [8];
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  undefined4 local_54;
  int *local_50;
  int *local_48;
  CF2_Stack local_40;
  FT_Bool local_31;
  
  local_54 = (int)CONCAT71(in_register_00000089,doConditionalLastRead);
  local_40 = opStack;
  local_98[0] = *curX;
  local_50 = curY;
  local_98[1] = *curY;
  FVar1 = readFromStack[9];
  local_31 = FVar1;
  idx = 0;
  local_48 = curX;
  local_a0 = glyphPath;
  for (lVar7 = 0; piVar3 = local_50, 10 - (ulong)(FVar1 == '\0') != lVar7; lVar7 = lVar7 + 1) {
    iVar2 = local_98[lVar7];
    aiStack_90[lVar7] = iVar2;
    if (readFromStack[lVar7] != '\0') {
      uStackY_b0 = 0x20b6c9;
      CVar4 = cf2_stack_getReal(local_40,idx);
      aiStack_90[lVar7] = CVar4 + iVar2;
      curX = local_48;
      idx = idx + 1;
    }
  }
  if (local_31 == '\0') {
    local_6c = *local_50;
  }
  iVar2 = local_6c;
  if ((char)local_54 == '\0') {
    if (readFromStack[10] == '\0') {
      iVar8 = *curX;
    }
    else {
      uStackY_b0 = 0x20b75a;
      CVar4 = cf2_stack_getReal(local_40,idx);
      iVar8 = CVar4 + local_70;
      curX = local_48;
      idx = idx + 1;
    }
    iVar2 = local_6c;
    local_68 = iVar8;
    if (readFromStack[0xb] == '\0') {
      local_64 = *local_50;
    }
    else {
      uStackY_b0 = 0x20b79c;
      CVar4 = cf2_stack_getReal(local_40,idx);
      local_64 = CVar4 + iVar2;
    }
  }
  else {
    iVar5 = local_70 - *curX;
    iVar8 = -iVar5;
    if (0 < iVar5) {
      iVar8 = iVar5;
    }
    iVar6 = local_6c - *local_50;
    iVar5 = -iVar6;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    uStackY_b0 = 0x20b724;
    CVar4 = cf2_stack_getReal(local_40,idx);
    curX = local_48;
    if (iVar5 < iVar8) {
      iVar8 = CVar4 + local_70;
      local_68 = iVar8;
      local_64 = *piVar3;
    }
    else {
      iVar8 = *local_48;
      local_68 = iVar8;
      local_64 = CVar4 + iVar2;
    }
  }
  iVar2 = local_64;
  for (lVar7 = 0x1c; lVar7 != 0x4c; lVar7 = lVar7 + 0x18) {
    uStackY_b0 = 0x20b7f3;
    cf2_glyphpath_curveTo
              (local_a0,*(CF2_F16Dot16 *)((long)&uStackY_b0 + lVar7 + 4),
               *(CF2_F16Dot16 *)((long)aiStack_90 + lVar7 + -0x18),
               *(CF2_F16Dot16 *)((long)&CStack_a4 + lVar7),
               *(CF2_F16Dot16 *)((long)local_98 + lVar7 + -8),
               *(CF2_F16Dot16 *)((long)local_98 + lVar7 + -4),
               *(CF2_F16Dot16 *)((long)local_98 + lVar7));
  }
  local_40->top = local_40->buffer;
  *curX = iVar8;
  *local_50 = iVar2;
  return;
}

Assistant:

static void
  cf2_doFlex( CF2_Stack       opStack,
              CF2_Fixed*      curX,
              CF2_Fixed*      curY,
              CF2_GlyphPath   glyphPath,
              const FT_Bool*  readFromStack,
              FT_Bool         doConditionalLastRead )
  {
    CF2_Fixed  vals[14];
    CF2_UInt   idx;
    FT_Bool    isHFlex;
    CF2_Int    top, i, j;


    vals[0] = *curX;
    vals[1] = *curY;
    idx     = 0;
    isHFlex = FT_BOOL( readFromStack[9] == FALSE );
    top     = isHFlex ? 9 : 10;

    for ( i = 0; i < top; i++ )
    {
      vals[i + 2] = vals[i];
      if ( readFromStack[i] )
        vals[i + 2] = ADD_INT32( vals[i + 2], cf2_stack_getReal( opStack,
                                                                 idx++ ) );
    }

    if ( isHFlex )
      vals[9 + 2] = *curY;

    if ( doConditionalLastRead )
    {
      FT_Bool    lastIsX = (FT_Bool)(
                             cf2_fixedAbs( SUB_INT32( vals[10], *curX ) ) >
                             cf2_fixedAbs( SUB_INT32( vals[11], *curY ) ) );
      CF2_Fixed  lastVal = cf2_stack_getReal( opStack, idx );


      if ( lastIsX )
      {
        vals[12] = ADD_INT32( vals[10], lastVal );
        vals[13] = *curY;
      }
      else
      {
        vals[12] = *curX;
        vals[13] = ADD_INT32( vals[11], lastVal );
      }
    }
    else
    {
      if ( readFromStack[10] )
        vals[12] = ADD_INT32( vals[10],
                              cf2_stack_getReal( opStack, idx++ ) );
      else
        vals[12] = *curX;

      if ( readFromStack[11] )
        vals[13] = ADD_INT32( vals[11],
                              cf2_stack_getReal( opStack, idx ) );
      else
        vals[13] = *curY;
    }

    for ( j = 0; j < 2; j++ )
      cf2_glyphpath_curveTo( glyphPath, vals[j * 6 + 2],
                                        vals[j * 6 + 3],
                                        vals[j * 6 + 4],
                                        vals[j * 6 + 5],
                                        vals[j * 6 + 6],
                                        vals[j * 6 + 7] );

    cf2_stack_clear( opStack );

    *curX = vals[12];
    *curY = vals[13];
  }